

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void ui_leave_init(game_event_type type,game_event_data *data,void *user)

{
  _Bool _Var1;
  size_t sVar2;
  char acStack_498 [128];
  char buf [1024];
  
  reset_visuals(true);
  process_pref_file("window.prf",true,true);
  process_pref_file("user.prf",true,true);
  player_safe_name(buf,0x400,player->full_name,true);
  my_strcat(buf,".prf",0x400);
  _Var1 = process_pref_file(buf,true,true);
  if (!_Var1) {
    sVar2 = path_filename_index(savefile);
    my_strcpy(acStack_498,savefile + (int)sVar2,0x80);
    strnfmt(buf,0x400,"%s.prf",acStack_498);
    process_pref_file(buf,true,true);
  }
  Term_xtra(L'\n',L'\0');
  Term_redraw_all();
  event_remove_handler(EVENT_INITSTATUS,splashscreen_note,(void *)0x0);
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  return;
}

Assistant:

static void ui_leave_init(game_event_type type, game_event_data *data,
						  void *user)
{
	/* Reset visuals, then load prefs, and react to changes */
	reset_visuals(true);
	process_character_pref_files();
	Term_xtra(TERM_XTRA_REACT, 0);
	(void) Term_redraw_all();

	/* Remove our splashscreen handlers */
	event_remove_handler(EVENT_INITSTATUS, splashscreen_note, NULL);

	/* Flash a message */
	prt("Please wait...", 0, 0);

	/* Flush the message */
	Term_fresh();
}